

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedWriters.cpp
# Opt level: O2

int main(void)

{
  atomic<unsigned_long> aVar1;
  __atomic_base<unsigned_long> _Var2;
  nanoseconds nVar3;
  SessionWriter writer2;
  SessionWriter writer;
  Session session;
  allocator local_345;
  allocator local_344;
  allocator local_343;
  allocator local_342;
  allocator local_341;
  SessionWriter local_340;
  SessionWriter local_310;
  ConsumeResult local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  undefined1 local_240 [48];
  string local_210 [32];
  string local_1f0 [32];
  uint64_t local_1d0;
  string local_1c8 [32];
  string local_1a8 [32];
  undefined1 local_188 [48];
  string local_158 [32];
  string local_138 [32];
  uint64_t local_118;
  string local_110 [32];
  string local_f0 [32];
  Session local_d0;
  
  binlog::Session::Session(&local_d0);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  binlog::SessionWriter::SessionWriter(&local_310,&local_d0,0x100000,0,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::string((string *)&local_280,"w1",(allocator *)&local_340);
  binlog::SessionWriter::setName(&local_310,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  if (((local_310._session)->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      local_188._0_8_ = 0;
      local_188._8_2_ = info;
      std::__cxx11::string::string((string *)(local_188 + 0x10),"main",(allocator *)&local_340);
      std::__cxx11::string::string(local_158,"main",(allocator *)&local_2e0);
      std::__cxx11::string::string
                (local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/NamedWriters.cpp"
                 ,&local_342);
      local_118 = 0xc;
      std::__cxx11::string::string(local_110,"Hello named writer",&local_343);
      local_344 = (allocator)0x0;
      std::__cxx11::string::string(local_f0,(char *)&local_344,&local_345);
      _Var2._M_i = binlog::Session::addEventSource(local_310._session,(EventSource *)local_188);
      binlog::EventSource::~EventSource((EventSource *)local_188);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar1.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    nVar3 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (&local_310,(uint64_t)aVar1.super___atomic_base<unsigned_long>._M_i,nVar3.__r);
  }
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  binlog::SessionWriter::SessionWriter(&local_340,&local_d0,0x100000,0,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2c0,"w2",(allocator *)&local_2e0);
  binlog::SessionWriter::setName(&local_340,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  if (((local_340._session)->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      local_240._0_8_ = 0;
      local_240._8_2_ = info;
      std::__cxx11::string::string((string *)(local_240 + 0x10),"main",(allocator *)&local_2e0);
      std::__cxx11::string::string(local_210,"main",&local_342);
      std::__cxx11::string::string
                (local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/NamedWriters.cpp"
                 ,&local_343);
      local_1d0 = 0x12;
      std::__cxx11::string::string(local_1c8,"Hello other named writer",&local_344);
      local_345 = (allocator)0x0;
      std::__cxx11::string::string(local_1a8,(char *)&local_345,&local_341);
      _Var2._M_i = binlog::Session::addEventSource(local_340._session,(EventSource *)local_240);
      binlog::EventSource::~EventSource((EventSource *)local_240);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    aVar1.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    nVar3 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (&local_340,(uint64_t)aVar1.super___atomic_base<unsigned_long>._M_i,nVar3.__r);
  }
  binlog::Session::consume<std::ostream>
            (&local_2e0,&local_d0,(basic_ostream<char,_std::char_traits<char>_> *)&std::cout);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_340._channel.
              super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_310._channel.
              super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  binlog::Session::~Session(&local_d0);
  return 0;
}

Assistant:

int main()
{
  binlog::Session session;
  binlog::SessionWriter writer(session);

  //[setName
  writer.setName("w1");
  BINLOG_INFO_W(writer, "Hello named writer");
  // Outputs: w1 Hello named writer
  //]

  binlog::SessionWriter writer2(session);
  writer2.setName("w2");
  BINLOG_INFO_W(writer2, "Hello other named writer");
  // Outputs: w2 Hello other named writer

  session.consume(std::cout);
  return 0;
}